

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O3

void device_reset_c352(void *chip)

{
  byte *pbVar1;
  long lVar2;
  C352 *c;
  uint uVar3;
  long lVar4;
  
  pbVar1 = (byte *)((long)chip + 0x2c);
  lVar2 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 | (uint)*pbVar1 << ((byte)lVar2 & 0x1f);
    lVar2 = lVar2 + 1;
    pbVar1 = pbVar1 + 0x24;
  } while (lVar2 != 0x20);
  lVar4 = 0;
  memset((void *)((long)chip + 0xc),0,0x480);
  *(undefined4 *)((long)chip + 0x48c) = 0x1234;
  lVar2 = (long)chip + 0x2c;
  do {
    *(bool *)lVar2 = (uVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0;
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x24;
  } while (lVar4 != 0x20);
  return;
}

Assistant:

static void device_reset_c352(void *chip)
{
	C352 *c = (C352 *)chip;
	UINT32 muteMask;
	
	muteMask = c352_get_mute_mask(c);
	
	// clear all channels states
	memset(c->v,0,sizeof(C352_Voice)*C352_VOICES);
	
	// init noise generator
	c->random = 0x1234;
	c->control = 0;
	
	c352_set_mute_mask(c, muteMask);
	
	return;
}